

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O2

LispPTR DSK_getfilename(LispPTR *args)

{
  uint uVar1;
  char *pcVar2;
  int iVar3;
  LispPTR *pLVar4;
  long lVar5;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  long lVar9;
  DLword *pDVar10;
  LispPTR LVar11;
  long lStack_4240;
  char ver [16];
  char aname [255];
  char name [255];
  char dir [4096];
  char vname [4096];
  char lfname [4096];
  char file [4096];
  
  iVar3 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar3 != 0) {
    *Lisp_errno = 100;
    return 0;
  }
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[3]);
  pLVar4 = NativeAligned4FromLAddr(*args);
  if (*(char *)((long)pLVar4 + 6) == 'D') {
    LVar11 = pLVar4[2] * 2;
    lStack_4240 = 5;
LAB_0011912c:
    if (0x1000 < (ulong)((int)LVar11 + lStack_4240)) {
      *Lisp_errno = 200;
      return 0;
    }
  }
  else {
    if (*(char *)((long)pLVar4 + 6) == 'C') {
      LVar11 = pLVar4[2];
      lStack_4240 = 3;
      goto LAB_0011912c;
    }
    error("LispStringLength: Not a character array.\n");
  }
  pLVar4 = NativeAligned4FromLAddr(*args);
  LVar11 = 0x1000;
  if ((int)pLVar4[2] < 0x1000) {
    LVar11 = pLVar4[2];
  }
  lVar5 = (long)(int)LVar11;
  if (*(char *)((long)pLVar4 + 6) == 'D') {
    pDVar10 = Lisp_world + (ulong)(ushort)pLVar4[1] + (ulong)(*pLVar4 & 0xfffffff);
    for (lVar9 = 0; lVar5 != lVar9; lVar9 = lVar9 + 1) {
      lfname[lVar9] = *(char *)((ulong)pDVar10 ^ 2);
      pDVar10 = pDVar10 + 1;
    }
    lfname[lVar9] = '\0';
  }
  else if (*(char *)((long)pLVar4 + 6) == 'C') {
    uVar1 = *pLVar4;
    LVar11 = pLVar4[1];
    for (lVar9 = 0; lVar5 != lVar9; lVar9 = lVar9 + 1) {
      lfname[lVar9] =
           *(char *)((long)Lisp_world +
                     lVar9 + (ulong)(ushort)LVar11 + (ulong)(uVar1 & 0xfffffff) * 2 ^ 3);
    }
    lfname[lVar5] = '\0';
  }
  else {
    error("LispStringToCString: Not a character array.\n");
  }
  iVar3 = unixpathname(lfname,file,1,0);
  if (iVar3 == 0) {
    return 0;
  }
  iVar3 = unpack_filename(file,dir,name,ver,1);
  if (iVar3 == 0) {
    return 0;
  }
  switch(args[1]) {
  case 0xe0000:
    iVar3 = true_name(dir);
    if (iVar3 != -1) {
      return 0;
    }
    if (name[0] == '\0') {
      return 0;
    }
    iVar3 = get_version_array(dir,name);
    if (iVar3 == 0) {
      return 0;
    }
    strcpy(aname,name);
    if (ver[0] != '\0') {
      sVar7 = strlen(aname);
      (aname + sVar7)[0] = '.';
      (aname + sVar7)[1] = '~';
      aname[sVar7 + 2] = '\0';
      strcat(aname,ver);
      sVar7 = strlen(aname);
      (aname + sVar7)[0] = '~';
      (aname + sVar7)[1] = '\0';
    }
    iVar3 = get_old(dir,VA.files,aname,vname);
    goto LAB_0011943c;
  case 0xe0001:
    iVar3 = true_name(dir);
    if (iVar3 != -1) {
      return 0;
    }
    if (name[0] == '\0') {
      return 0;
    }
    iVar3 = get_version_array(dir,name);
    if (iVar3 == 0) {
      return 0;
    }
    strcpy(aname,name);
    if (ver[0] != '\0') {
      sVar7 = strlen(aname);
      (aname + sVar7)[0] = '.';
      (aname + sVar7)[1] = '~';
      aname[sVar7 + 2] = '\0';
      strcat(aname,ver);
      sVar7 = strlen(aname);
      (aname + sVar7)[0] = '~';
      (aname + sVar7)[1] = '\0';
    }
    iVar3 = get_oldest(dir,VA.files,aname,vname);
LAB_0011943c:
    if (iVar3 == 0) {
      return 0;
    }
    iVar3 = true_name(aname);
    if (iVar3 + 1U < 2) {
      return 0;
    }
    break;
  case 0xe0002:
    pcVar6 = dir;
    iVar3 = true_name(pcVar6);
    if (iVar3 == -1) {
      pcVar8 = pcVar6;
      if (name[0] == '\0') {
        return 0;
      }
      for (; (pcVar2 = pcVar8, *pcVar8 == '/' || (pcVar2 = pcVar6, *pcVar8 != '\0'));
          pcVar8 = pcVar8 + 1) {
        pcVar6 = pcVar2;
      }
      if (pcVar8 + -1 == pcVar6) {
        if (pcVar6 == dir) {
          aname[0] = '/';
          aname[1] = '\0';
        }
        else {
          strcpy(aname,dir);
        }
      }
      else {
        strcpy(aname,dir);
        sVar7 = strlen(aname);
        (aname + sVar7)[0] = '/';
        (aname + sVar7)[1] = '\0';
      }
      strcat(aname,name);
      iVar3 = true_name(aname);
      if (iVar3 == -1) {
        return 0;
      }
      iVar3 = get_version_array(dir,name);
      if (iVar3 == 0) {
        return 0;
      }
      strcpy(aname,name);
      if (ver[0] != '\0') {
        sVar7 = strlen(aname);
        (aname + sVar7)[0] = '.';
        (aname + sVar7)[1] = '~';
        aname[sVar7 + 2] = '\0';
        strcat(aname,ver);
        sVar7 = strlen(aname);
        (aname + sVar7)[0] = '~';
        (aname + sVar7)[1] = '\0';
      }
      iVar3 = get_new(dir,VA.files,aname,vname);
      goto LAB_001198b9;
    }
LAB_00119474:
    strcpy(vname,file);
    break;
  case 0xe0003:
    pcVar6 = dir;
    iVar3 = true_name(pcVar6);
    pcVar8 = pcVar6;
    if (iVar3 != -1) goto LAB_00119474;
    for (; (pcVar2 = pcVar8, *pcVar8 == '/' || (pcVar2 = pcVar6, *pcVar8 != '\0'));
        pcVar8 = pcVar8 + 1) {
      pcVar6 = pcVar2;
    }
    if (pcVar8 + -1 == pcVar6) {
      if (pcVar6 == dir) {
        aname[0] = '/';
        aname[1] = '\0';
      }
      else {
        strcpy(aname,dir);
      }
    }
    else {
      strcpy(aname,dir);
      sVar7 = strlen(aname);
      (aname + sVar7)[0] = '/';
      (aname + sVar7)[1] = '\0';
    }
    strcat(aname,name);
    iVar3 = true_name(aname);
    if (iVar3 == -1) {
      return 0;
    }
    iVar3 = get_version_array(dir,name);
    if (iVar3 == 0) {
      return 0;
    }
    strcpy(aname,name);
    if (ver[0] != '\0') {
      sVar7 = strlen(aname);
      (aname + sVar7)[0] = '.';
      (aname + sVar7)[1] = '~';
      aname[sVar7 + 2] = '\0';
      strcat(aname,ver);
      sVar7 = strlen(aname);
      (aname + sVar7)[0] = '~';
      (aname + sVar7)[1] = '\0';
    }
    iVar3 = get_old_new(dir,VA.files,aname,vname);
LAB_001198b9:
    if (iVar3 == 0) {
      return 0;
    }
    break;
  case 0xe0005:
    pcVar6 = dir;
    iVar3 = true_name(pcVar6);
    pcVar8 = pcVar6;
    if (iVar3 != -1) {
      return 0;
    }
    for (; (pcVar2 = pcVar8, *pcVar8 == '/' || (pcVar2 = pcVar6, *pcVar8 != '\0'));
        pcVar8 = pcVar8 + 1) {
      pcVar6 = pcVar2;
    }
    if (pcVar8 + -1 == pcVar6) {
      if (pcVar6 == dir) {
        vname[0] = '/';
        vname[1] = '\0';
      }
      else {
        strcpy(vname,dir);
      }
    }
    else {
      strcpy(vname,dir);
      sVar7 = strlen(vname);
      (vname + sVar7)[0] = '/';
      (vname + sVar7)[1] = '\0';
    }
    strcat(vname,name);
    strcpy(aname,vname);
    iVar3 = true_name(aname);
    if (iVar3 == -1) {
      strcpy(vname,aname);
    }
    iVar3 = lisppathname(vname,lfname,(uint)(iVar3 == -1),0);
    if (iVar3 == 0) {
      return 0;
    }
    pLVar4 = NativeAligned4FromLAddr(args[2]);
    pDVar10 = Lisp_world;
    uVar1 = *pLVar4;
    sVar7 = strlen(lfname);
    for (lVar5 = 0; sVar7 + 1 != lVar5; lVar5 = lVar5 + 1) {
      *(char *)((long)pDVar10 + lVar5 + (ulong)((uVar1 & 0xfffffff) * 2) ^ 3) = lfname[lVar5];
    }
    goto LAB_001197f4;
  }
  LVar11 = 0;
  iVar3 = lisppathname(vname,lfname,0,1);
  if (iVar3 != 0) {
    pLVar4 = NativeAligned4FromLAddr(args[2]);
    pDVar10 = Lisp_world;
    uVar1 = *pLVar4;
    sVar7 = strlen(lfname);
    for (lVar5 = 0; sVar7 + 1 != lVar5; lVar5 = lVar5 + 1) {
      *(char *)((long)pDVar10 + lVar5 + (ulong)((uVar1 & 0xfffffff) * 2) ^ 3) = lfname[lVar5];
    }
LAB_001197f4:
    LVar11 = GetPosSmallp(sVar7);
  }
  return LVar11;
}

Assistant:

LispPTR DSK_getfilename(LispPTR *args)
{
  char *base;
  size_t len;
  int rval;
  int dirp;
  int fatp;
  char lfname[MAXPATHLEN];
  char aname[MAXNAMLEN];
  char vname[MAXPATHLEN];
  char file[MAXPATHLEN];
  char dir[MAXPATHLEN];
  char name[MAXNAMLEN];
  char ver[VERSIONLEN];
#ifdef DOS
  char drive[1], rawname[MAXNAMLEN];
  int extlen; /* len of extension, for making backup filename */
#endif        /* DOS */

  ERRSETJMP(NIL);
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[3]);

  LispStringLength(args[0], len, fatp);
  /*
   * Because of the version number convention, Lisp pathname might
   * be shorter than UNIX one.  For THIN string, the difference
   * is 2 bytes, for FAT string, 4 bytes.  Add 1 byte for NULL
   * terminating character.
   */
  len = fatp ? len + 4 + 1 : len + 2 + 1;
  if (len > MAXPATHLEN) FileNameTooLong(NIL);

  LispStringToCString(args[0], lfname, MAXPATHLEN);

#ifdef DOS
  separate_drive(lfname, drive);
#endif

/*
 * Convert a Lisp file name to UNIX one.  This is a DSK device method.
 * Thus we have to convert a version field too.  Third argument for
 * unixpathname specifies it.
 */
#ifdef DOS
  if (unixpathname(lfname, file, 1, 0, drive, &extlen, rawname) == 0) return (NIL);
#else
  if (unixpathname(lfname, file, 1, 0) == 0) return (NIL);
#endif

  if (unpack_filename(file, dir, name, ver, 1) == 0) return (NIL);

  switch (args[1]) {
    case RECOG_OLD:
      /*
       * "Old" file means the "newest existing" file.  Thus, we have to
       * check dir is an existing directory or not.  The search has to
       * be done in case insensitive manner.  true_name does this work.
       */

      if (true_name(dir) != -1) {
        /* No such directory. */
        return (NIL);
      }
      /*
       * At this point, true_name has converted dir to the "true" name
       * of the directory.
       */
      if (strcmp(name, "") == 0) {
        /*
         * The file name is specified with a trail directory delimiter.
         * We should recognize it as a directory.
         */
        strcpy(aname, dir);
        strcpy(vname, dir);
        dirp = 1;
      } else {
        /*
         * Recognizing a file on DSK device needs the version information.
         * We gather version information in a version array first.
         */
        if (get_version_array(dir, name) == 0) return (NIL);

        ConcNameAndVersion(name, ver, aname);
        if (get_old(dir, VA.files, aname, vname) == 0) return (NIL);

        if ((rval = true_name(aname)) == 0) return (NIL);
        if (rval == -1) {
          /*
           * The specified file is a directory file.
           */
          strcpy(vname, aname);
          dirp = 1;
        } else {
#ifdef DOS
          strcpy(vname, aname);
#endif
          dirp = 0;
        }
      }

      break;

    case RECOG_OLDEST:
      /*
       * "Oldest" file means the "oldest existing" file.  Thus, we have to
       * check dir is an existing directory or not.
       */
      if (true_name(dir) != -1) {
        /* No such directory. */
        return (NIL);
      }
      if (strcmp(name, "") == 0) {
        /*
         * The file name is specified with a trail directory delimiter.
         * We should recognize it as a directory.
         */
        strcpy(aname, dir);
        strcpy(vname, dir);
        dirp = 1;
      } else {
        if (get_version_array(dir, name) == 0) return (NIL);

        ConcNameAndVersion(name, ver, aname);
        if (get_oldest(dir, VA.files, aname, vname) == 0) return (NIL);

        if ((rval = true_name(aname)) == 0) return (NIL);
        if (rval == -1) {
          /*
           * The specified file is a directory file.
           */
          strcpy(vname, aname);
          dirp = 1;
        } else {
#ifdef DOS
          strcpy(vname, aname);
#endif
          dirp = 0;
        }
      }
      break;

    case RECOG_NEW:
      /*
       * "New" file means the "not existing" file.  Thus it is not
       * necessary that dir is an existing directory.  If dir is not
       * an existing directory, we returns the specified file name
       * as if, the subsequent OPENFILE will find the truth.
       */
      if (true_name(dir) != -1) {
        strcpy(vname, file);
        dirp = 0;
      } else if (strcmp(name, "") == 0) {
        /*
         * The file name is specified with a trail directory delimiter.
         * We should recognize it as a directory.
         */
        strcpy(aname, dir);
        strcpy(vname, dir);
        dirp = 1;
      } else {
        ConcDirAndName(dir, name, aname);
        if ((rval = true_name(aname)) == -1) {
          strcpy(vname, aname);
          dirp = 1;
        } else {
          /*
           * Here, dir is an existing directory.  We have to perform
           * "new" recognition with the version information.
           */
          if (get_version_array(dir, name) == 0) return (NIL);

          ConcNameAndVersion(name, ver, aname);
          if (get_new(dir, VA.files, aname, vname) == 0) return (NIL);
          dirp = 0;
        }
      }
      break;

    case RECOG_OLD_NEW:
      /*
       * "Old/new" file means the "newest existing" or "not existing" file.
       * Thus, if dir is not an existing directory, we can return the
       * specified file name.  If it is an existing one, we have to
       * try "old" recognition on the directory first.  If the recognition
       * fails, we try "new" recognition.
       */
      if (true_name(dir) != -1) {
        strcpy(vname, file);
        dirp = 0;
      } else {
        ConcDirAndName(dir, name, aname);
        if ((rval = true_name(aname)) == -1) {
          strcpy(vname, aname);
          dirp = 1;
        } else {
          if (get_version_array(dir, name) == 0) return (NIL);

          ConcNameAndVersion(name, ver, aname);
          if (get_old_new(dir, VA.files, aname, vname) == 0) return (NIL);
          dirp = 0;
        }
      }
      break;

    case RECOG_NON:
      /*
       * "Non" recognition is used to recognize a sysout file.  The sysout
       * file is dealt with specially, it does not have any version, even
       * if it is on {DSK} device.  Only we have to do here is to make
       * sure the path to reach to the specified file is an existing
       * directories.  The file name itself is recognized as if.
       */
      if (true_name(dir) != -1) return (NIL);
      ConcDirAndName(dir, name, vname);
      strcpy(aname, vname);
      if (true_name(aname) == -1) {
        strcpy(vname, aname);
        dirp = 1;
      } else {
        dirp = 0;
      }
      if (lisppathname(vname, lfname, dirp, 0) == 0) return (NIL);
      STRING_BASE(args[2], base);
      len = strlen(lfname);

#ifndef BYTESWAP
      strncpy(base, lfname, len + 1);
#else
      StrNCpyFromCToLisp(base, lfname, len + 1);
#endif /* BYTESWAP */

      return (GetPosSmallp(len));
  }

  /*
   * DSK device does not recognize a directory file as a file.  Thus we should
   * return NIL when the recognized file is a directory.
   */
  if (dirp) return (NIL);

/*
 * Now, vname holds the "versioned" full name of the recognized file in UNIX
 * format.  We have to convert it back to Lisp format.  The version field
 * have to be converted.  The fourth argument for lisppathname specifies it.
 */
#ifdef DOS
  /* For DOS, have to assure we use the name asked for, not the */
  /* faked-up oversion-0 name, so reported names match. */
  {
    char dver[VERSIONLEN];
    separate_version(vname, dver, 0);
    ConcDirAndName(dir, name, aname);
    ConcNameAndVersion(aname, dver, vname);
  }
#endif /* DOS */

  if (lisppathname(vname, lfname, dirp, (dirp ? 0 : 1)) == 0) return (NIL);

  STRING_BASE(args[2], base);
  len = strlen(lfname);

#ifndef BYTESWAP
  strncpy(base, lfname, len + 1);
#else
  StrNCpyFromCToLisp(base, lfname, len + 1);
#endif /* BYTESWAP */

  return (GetPosSmallp(len));
}